

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

int cuddP(DdManager *dd,DdNode *f)

{
  st__table *t;
  st__table *table;
  int retval;
  DdNode *f_local;
  DdManager *dd_local;
  
  t = st__init_table(st__ptrcmp,st__ptrhash);
  if (t == (st__table *)0x0) {
    dd_local._4_4_ = 0;
  }
  else {
    dd_local._4_4_ = dp2(dd,f,t);
    st__free_table(t);
    fputc(10,(FILE *)dd->out);
  }
  return dd_local._4_4_;
}

Assistant:

int
cuddP(
  DdManager * dd,
  DdNode * f)
{
    int retval;
    st__table *table = st__init_table( st__ptrcmp, st__ptrhash);

    if (table == NULL) return(0);

    retval = dp2(dd,f,table);
    st__free_table(table);
    (void) fputc('\n',dd->out);
    return(retval);

}